

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_25a1::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  ushort uVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  int i;
  ulong uVar5;
  ushort *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong unaff_RBX;
  ulong uVar9;
  half tmp;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  half candidate [16];
  ushort local_58 [20];
  
  uVar10 = this->_startValue;
  if (uVar10 < this->_endValue) {
    do {
      if ((uVar10 * -0x70a3d70a3d70a3d7 >> 2 | uVar10 * -0x70a3d70a3d70a3d7 << 0x3e) <
          0x28f5c28f5c28f5d && outputProgress) {
        _GLOBAL__N_1::LutHeaderWorker::run();
      }
      uVar1 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)uVar10 & 0xff];
      uVar2 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)(uVar10 >> 8) & 0xff];
      this->_offset[uVar10 - this->_startValue] = this->_numElements;
      uVar13 = (uint)uVar2 + (uint)uVar1;
      if (uVar13 == 0) {
        uVar11 = 0;
      }
      else {
        uVar12 = (ulong)uVar13;
        uVar11 = 0;
        do {
          uVar13 = uVar13 - 1;
          uVar5 = 0;
          bVar4 = false;
          do {
            if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar5 >> 8 & 0xffffff] +
                (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar5 & 0xff] == uVar13) {
              if (bVar4) {
                uVar7 = uVar5;
                if (ABS(half::_toFloat[uVar10 & 0xffff].f - half::_toFloat[unaff_RBX & 0xffff].f) <=
                    ABS(half::_toFloat[uVar10 & 0xffff].f - half::_toFloat[uVar5].f)) {
                  uVar7 = unaff_RBX;
                }
                unaff_RBX = uVar7 & 0xffffffff;
              }
              else {
                bVar4 = true;
                unaff_RBX = uVar5 & 0xffffffff;
              }
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x10000);
          if (!bVar4) {
            _GLOBAL__N_1::LutHeaderWorker::run();
          }
          local_58[uVar11] = (ushort)unaff_RBX;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar12);
      }
      uVar12 = uVar11 & 0xffffffff;
      if ((int)uVar11 != 0) {
        puVar6 = local_58;
        uVar5 = uVar12;
        uVar7 = 0;
        do {
          uVar8 = uVar7 + 1;
          if (uVar8 < uVar12) {
            uVar9 = 1;
            do {
              uVar1 = local_58[uVar7];
              uVar2 = puVar6[uVar9];
              if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 & 0xff] <
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar1 & 0xff]) {
                local_58[uVar7] = uVar2;
                puVar6[uVar9] = uVar1;
              }
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          puVar6 = puVar6 + 1;
          uVar5 = uVar5 - 1;
          uVar7 = uVar8;
        } while (uVar8 != uVar12);
        sVar3 = this->_numElements;
        memcpy(this->_elements + sVar3,local_58,uVar12 * 2);
        this->_numElements = ((int)uVar11 - 1) + sVar3 + 1;
      }
      if (uVar10 == this->_endValue - 1) {
        this->_lastCandidateCount = uVar12;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < this->_endValue);
  }
  return;
}

Assistant:

void run(bool outputProgress)
            {
                half candidate[16];
                int  candidateCount = 0;

                for (size_t input=_startValue; input<_endValue; ++input) {

                    if (outputProgress) {
#ifdef __GNUC__
                        if (input % 100 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%      %c",
                                          100.*(float)input/(float)numValues(), 13);
                        }
#else
                        if (input % 1000 == 0) {
                            fprintf(stderr, 
                            " Building acceleration for DwaCompressor, %.2f %%\n",
                                          100.*(float)input/(float)numValues());
                        }
#endif
                    } 

                    
                    int  numSetBits = countSetBits(input);
                    half inputHalf, closestHalf;

                    inputHalf.setBits(input);

                    _offset[input - _startValue] = _numElements;

                    // Gather candidates
                    candidateCount = 0;
                    for (int targetNumSetBits=numSetBits-1; targetNumSetBits>=0;
                                                           --targetNumSetBits) {
                        bool valueFound = false;

                        for (int i=0; i<65536; ++i) {
                            if (countSetBits(i) != targetNumSetBits) continue;

                            if (!valueFound) {
                                closestHalf.setBits(i);
                                valueFound = true;
                            } else {
                                half tmpHalf;

                                tmpHalf.setBits(i);

                                if (fabs((float)inputHalf - (float)tmpHalf) < 
                                    fabs((float)inputHalf - (float)closestHalf)) {
                                    closestHalf = tmpHalf;
                                }
                            }
                        }

                        if (valueFound == false) {
                            fprintf(stderr, "bork bork bork!\n");
                        }       

                        candidate[candidateCount] = closestHalf;
                        candidateCount++;
                    }

                    // Sort candidates by increasing number of bits set
                    for (int i=0; i<candidateCount; ++i) {
                        for (int j=i+1; j<candidateCount; ++j) {

                            int   iCnt = countSetBits(candidate[i].bits());
                            int   jCnt = countSetBits(candidate[j].bits());

                            if (jCnt < iCnt) {
                                half tmp     = candidate[i];
                                candidate[i] = candidate[j];
                                candidate[j] = tmp;
                            }
                        }
                    }

                    // Copy candidates to the data buffer;
                    for (int i=0; i<candidateCount; ++i) {
                        _elements[_numElements] = candidate[i].bits();
                        _numElements++;
                    }

                    if (input == _endValue-1) {
                        _lastCandidateCount = candidateCount;
                    }
                }
            }